

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask25_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  uint uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  uVar1 = in[1];
  vpmovsxbd_avx2(ZEXT816(0x2c28201c18140c08));
  auVar5 = vpmovsxbd_avx2(ZEXT816(0x709050403080100));
  uVar2 = in[0xc];
  uVar3 = in[0xd];
  auVar4 = vpinsrd_avx(ZEXT416(in[4]),in[9],1);
  auVar6 = vpsllvd_avx2(auVar4,_DAT_001a2c80);
  uVar7 = uVar2 << 0xc;
  *out = uVar1 << 0x19 | *in;
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar7));
  auVar4 = vpmovsxbd_avx(ZEXT416(0x501));
  auVar9 = vpermd_avx2(ZEXT1632(auVar4),auVar8);
  auVar4 = vpsrlvd_avx2(auVar9._0_16_,_DAT_001a4d40);
  auVar4 = vpor_avx(auVar6,auVar4);
  auVar9 = valignd_avx512vl(auVar8,auVar8,7);
  auVar9 = vpblendd_avx2(auVar9,ZEXT432(uVar1),1);
  auVar9 = vpsrlvd_avx2(auVar9,_DAT_0019fe20);
  auVar9 = vpermi2d_avx512vl(auVar5,auVar9,ZEXT1632(auVar4));
  auVar5 = vpsllvd_avx2(auVar8,_DAT_001ae560);
  auVar5 = vpor_avx2(auVar5,auVar9);
  *(undefined1 (*) [32])(out + 1) = auVar5;
  out[9] = uVar7 | auVar8._28_4_ >> 0xd;
  uVar1 = in[0xe];
  uVar7 = in[0xf];
  out[10] = uVar1 << 0x1e | uVar3 << 5 | uVar2 >> 0x14;
  out[0xb] = uVar7 << 0x17 | uVar1 >> 2;
  out[0xc] = uVar7 >> 9;
  return out + 0xd;
}

Assistant:

uint32_t *__fastpackwithoutmask25_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (25 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (25 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (25 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (25 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (25 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (25 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (25 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (25 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (25 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (25 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (25 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (25 - 16);
  ++in;

  return out + 1;
}